

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::UnicodeString::setTo
          (UnicodeString *this,UBool isTerminated,ConstChar16Ptr *textPtr,int32_t textLength)

{
  UChar *s;
  
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x10) ==
      (undefined1  [56])0x0) {
    s = textPtr->p_;
    if (s == (UChar *)0x0) {
      releaseArray(this);
      (this->fUnion).fStackFields.fLengthAndFlags = 2;
    }
    else if (((textLength < -1) || (isTerminated == '\0' && textLength == -1)) ||
            ((textLength != -1 && isTerminated != '\0' && (s[(uint)textLength] != L'\0')))) {
      setToBogus(this);
    }
    else {
      releaseArray(this);
      if (textLength == -1) {
        textLength = u_strlen_63(s);
      }
      (this->fUnion).fStackFields.fLengthAndFlags = 8;
      setLength(this,textLength);
      (this->fUnion).fFields.fArray = s;
      (this->fUnion).fFields.fCapacity = (textLength + 1) - (uint)(isTerminated == '\0');
    }
  }
  return this;
}

Assistant:

UnicodeString &
UnicodeString::setTo(UBool isTerminated,
                     ConstChar16Ptr textPtr,
                     int32_t textLength)
{
  if(fUnion.fFields.fLengthAndFlags & kOpenGetBuffer) {
    // do not modify a string that has an "open" getBuffer(minCapacity)
    return *this;
  }

  const UChar *text = textPtr;
  if(text == NULL) {
    // treat as an empty string, do not alias
    releaseArray();
    setToEmpty();
    return *this;
  }

  if( textLength < -1 ||
      (textLength == -1 && !isTerminated) ||
      (textLength >= 0 && isTerminated && text[textLength] != 0)
  ) {
    setToBogus();
    return *this;
  }

  releaseArray();

  if(textLength == -1) {
    // text is terminated, or else it would have failed the above test
    textLength = u_strlen(text);
  }
  fUnion.fFields.fLengthAndFlags = kReadonlyAlias;
  setArray((UChar *)text, textLength, isTerminated ? textLength + 1 : textLength);
  return *this;
}